

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cc
# Opt level: O2

void __thiscall avro::Name::fullname(Name *this,string *name)

{
  long lVar1;
  string local_40 [32];
  
  lVar1 = std::__cxx11::string::rfind((char)name,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::_M_assign((string *)&this->simpleName_);
    (this->ns_)._M_string_length = 0;
    *(this->ns_)._M_dataplus._M_p = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)name);
    std::__cxx11::string::operator=((string *)this,local_40);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::substr((ulong)local_40,(ulong)name);
    std::__cxx11::string::operator=((string *)&this->simpleName_,local_40);
    std::__cxx11::string::~string(local_40);
  }
  check(this);
  return;
}

Assistant:

void Name::fullname(const string& name)
{
    string::size_type n = name.find_last_of('.');
    if (n == string::npos) {
        simpleName_ = name;
        ns_.clear();
    } else {
        ns_ = name.substr(0, n);
        simpleName_ = name.substr(n + 1);
    }
    check();
}